

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayTex3DValidation.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArrayTex3DValidation::deleteTexture(TextureCubeMapArrayTex3DValidation *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if ((this->super_TestCaseBase).m_is_texture_cube_map_array_supported == true) {
    (**(code **)(lVar3 + 0xb8))(0x9009,0);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,
                    "glBindTexture() call failed for GL_TEXTURE_CUBE_MAP_ARRAY_EXT texture target",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayTex3DValidation.cpp"
                    ,0xf9);
  }
  if (this->m_to_id != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glDeleteTextures() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayTex3DValidation.cpp"
                    ,0x100);
    this->m_to_id = 0;
  }
  return;
}

Assistant:

void TextureCubeMapArrayTex3DValidation::deleteTexture()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_is_texture_cube_map_array_supported)
	{
		/* Unbind any bound texture to GL_TEXTURE_CUBE_MAP_ARRAY_EXT target */
		gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(),
							"glBindTexture() call failed for GL_TEXTURE_CUBE_MAP_ARRAY_EXT texture target");
	}

	/* Delete texture object */
	if (m_to_id != 0)
	{
		gl.deleteTextures(1, &m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures() call failed");

		m_to_id = 0;
	}
}